

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O3

_Bool borg_caution_phase(wchar_t emergency,wchar_t turns)

{
  loc_conflict grid1;
  int iVar1;
  int iVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  loc_conflict grid2;
  uint uVar7;
  uint uVar8;
  int iVar9;
  wchar_t wVar10;
  char *pcVar11;
  wchar_t y;
  wchar_t X;
  borg_grid *local_48;
  
  wVar10 = L'\0';
  if (borg.trait[0xd2] != 0) {
    local_48 = borg_grids[borg.c.y] + borg.c.x;
    iVar9 = 0;
    do {
      uVar8 = 0;
      do {
        do {
          iVar2 = borg.c.y;
          uVar4 = Rand_div(0x15);
          iVar1 = borg.c.x;
          y = iVar2 + uVar4 + L'\xfffffff6';
          uVar5 = Rand_div(0x15);
          X = iVar1 + uVar5 + L'\xfffffff6';
          grid2 = loc(X,y);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar6 = distance(grid1,grid2);
        } while (5 < (uint)(wVar6 + L'\xfffffffb'));
        if ((((0xffffff3b < (uVar5 + iVar1) - 0xcf && 0xffffffbf < (uVar4 + iVar2) - 0x4b) &&
             (local_48 = borg_grids[(uint)y] + (uint)X, local_48->feat != '\0')) &&
            (_Var3 = borg_cave_floor_bold(y,X), _Var3)) &&
           ((local_48->kill == '\0' && (local_48->web != true)))) goto LAB_002062c5;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 100);
      uVar8 = 100;
LAB_002062c5:
      if (local_48->feat == '\0') {
        uVar7 = 1;
        if (uVar8 < 100 && 0x1d < borg.trait[0x1c]) goto LAB_002062dd;
      }
      else {
        uVar7 = 1;
        if (uVar8 < 100) {
LAB_002062dd:
          wVar6 = borg_danger(y,X,turns,true,false);
          uVar7 = (uint)(borg.trait[0x1b] < wVar6);
        }
      }
      wVar10 = wVar10 + uVar7;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 100);
    pcVar11 = "# No Phase. scary squares: %d";
    if (wVar10 <= emergency) {
      pcVar11 = "# Safe to Phase. scary squares: %d";
    }
    pcVar11 = format(pcVar11);
    borg_note(pcVar11);
    wVar10 = (wchar_t)(wVar10 <= emergency);
  }
  return SUB41(wVar10,0);
}

Assistant:

bool borg_caution_phase(int emergency, int turns)
{
    int n, k, i, d, x, y, p;

    int dis       = 10;
    int min       = dis / 2;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* must have the ability */
    if (!borg.trait[BI_APHASE])
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 1))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 1))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids */
            if (ag->feat == FEAT_NONE)
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Skip webs */
            if (ag->web)
                continue;

            /* Stop looking */
            break;
        }

        /* If low level, unknown squares are scary */
        if (ag->feat == FEAT_NONE && borg.trait[BI_MAXHP] < 30) {
            n++;
            continue;
        }

        /* No location */
        /* in the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but may be dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine */
        p = borg_danger(y, x, turns, true, false);

        /* if *very* scary, do not allow jumps at all */
        if (p > borg.trait[BI_CURHP])
            n++;
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Phase. scary squares: %d", n));
        return false;
    } else
        borg_note(format("# Safe to Phase. scary squares: %d", n));

    /* Okay */
    return true;
}